

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeUpdateMeta(Btree *p,int idx,u32 iMeta)

{
  long lVar1;
  long lVar2;
  int iVar3;
  u32 in_EDX;
  int in_ESI;
  long in_RDI;
  int rc;
  uchar *pP1;
  BtShared *pBt;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 uVar4;
  
  lVar1 = *(long *)(in_RDI + 8);
  uVar4 = 0xaaaaaaaa;
  sqlite3BtreeEnter((Btree *)0x13c7d0);
  lVar2 = *(long *)(*(long *)(lVar1 + 0x18) + 0x50);
  iVar3 = sqlite3PagerWrite((PgHdr *)CONCAT44(uVar4,in_stack_ffffffffffffffd8));
  if ((iVar3 == 0) && (sqlite3Put4byte((uchar *)(lVar2 + (in_ESI * 4 + 0x24)),in_EDX), in_ESI == 7))
  {
    *(char *)(lVar1 + 0x22) = (char)in_EDX;
  }
  sqlite3BtreeLeave((Btree *)0x13c83d);
  return iVar3;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeUpdateMeta(Btree *p, int idx, u32 iMeta){
  BtShared *pBt = p->pBt;
  unsigned char *pP1;
  int rc;
  assert( idx>=1 && idx<=15 );
  sqlite3BtreeEnter(p);
  assert( p->inTrans==TRANS_WRITE );
  assert( pBt->pPage1!=0 );
  pP1 = pBt->pPage1->aData;
  rc = sqlite3PagerWrite(pBt->pPage1->pDbPage);
  if( rc==SQLITE_OK ){
    put4byte(&pP1[36 + idx*4], iMeta);
#ifndef SQLITE_OMIT_AUTOVACUUM
    if( idx==BTREE_INCR_VACUUM ){
      assert( pBt->autoVacuum || iMeta==0 );
      assert( iMeta==0 || iMeta==1 );
      pBt->incrVacuum = (u8)iMeta;
    }
#endif
  }
  sqlite3BtreeLeave(p);
  return rc;
}